

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O3

void __thiscall wasm::StackIRGenerator::emit(StackIRGenerator *this,Expression *curr)

{
  pointer *pppSVar1;
  Id IVar2;
  iterator __position;
  Op op;
  StackInst *local_18;
  
  IVar2 = curr->_id;
  if (IVar2 < LoopId) {
    if (IVar2 == BlockId) {
      op = BlockBegin;
      goto LAB_00c9e4c4;
    }
    if (IVar2 == IfId) {
      op = IfBegin;
      goto LAB_00c9e4c4;
    }
  }
  else {
    if (IVar2 == LoopId) {
      op = LoopBegin;
      goto LAB_00c9e4c4;
    }
    if (IVar2 == TryId) {
      op = TryBegin;
      goto LAB_00c9e4c4;
    }
    if (IVar2 == TryTableId) {
      op = TryTableBegin;
      goto LAB_00c9e4c4;
    }
  }
  op = Basic;
LAB_00c9e4c4:
  local_18 = makeStackInst(this,op,curr);
  __position._M_current =
       (this->stackIR).super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->stackIR).super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<wasm::StackInst*,std::allocator<wasm::StackInst*>>::
    _M_realloc_insert<wasm::StackInst*const&>
              ((vector<wasm::StackInst*,std::allocator<wasm::StackInst*>> *)&this->stackIR,
               __position,&local_18);
  }
  else {
    *__position._M_current = local_18;
    pppSVar1 = &(this->stackIR).
                super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppSVar1 = *pppSVar1 + 1;
  }
  return;
}

Assistant:

void StackIRGenerator::emit(Expression* curr) {
  StackInst* stackInst = nullptr;
  if (curr->is<Block>()) {
    stackInst = makeStackInst(StackInst::BlockBegin, curr);
  } else if (curr->is<If>()) {
    stackInst = makeStackInst(StackInst::IfBegin, curr);
  } else if (curr->is<Loop>()) {
    stackInst = makeStackInst(StackInst::LoopBegin, curr);
  } else if (curr->is<Try>()) {
    stackInst = makeStackInst(StackInst::TryBegin, curr);
  } else if (curr->is<TryTable>()) {
    stackInst = makeStackInst(StackInst::TryTableBegin, curr);
  } else {
    stackInst = makeStackInst(curr);
  }
  stackIR.push_back(stackInst);
}